

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::Resize
          (TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *this,int64_t newsize)

{
  pair<int,_TPZFront<float>::STensorProductMTData_*> **pppVar1;
  ostream *poVar2;
  pair<int,_TPZFront<float>::STensorProductMTData_*> **pppVar3;
  long lVar4;
  long lVar5;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar5 = this->fNElements;
  if (lVar5 == newsize) {
    return;
  }
  if (newsize == 0) {
    this->fNElements = 0;
    this->fNAlloc = 0;
    if (this->fStore != (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0) {
      operator_delete__(this->fStore);
    }
    this->fStore = (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0;
    return;
  }
  pppVar3 = (pair<int,_TPZFront<float>::STensorProductMTData_*> **)
            operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8);
  if (newsize <= lVar5) {
    lVar5 = newsize;
  }
  pppVar1 = this->fStore;
  if (lVar5 < 1) {
    if (pppVar1 == (pair<int,_TPZFront<float>::STensorProductMTData_*> **)0x0) goto LAB_012b852b;
  }
  else {
    lVar4 = 0;
    do {
      pppVar3[lVar4] = pppVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  operator_delete__(pppVar1);
LAB_012b852b:
  this->fStore = pppVar3;
  this->fNElements = newsize;
  this->fNAlloc = newsize;
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}